

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_dump.c
# Opt level: O0

void decode_help_display(void)

{
  FILE *__stream;
  undefined8 uVar1;
  
  __stream = _stdout;
  uVar1 = opj_version();
  fprintf(__stream,
          "\nThis is the opj_dump utility from the OpenJPEG project.\nIt dumps JPEG 2000 codestream info to stdout or a given file.\nIt has been compiled against openjp2 library v%s.\n\n"
          ,uVar1);
  fprintf(_stdout,"Parameters:\n");
  fprintf(_stdout,"-----------\n");
  fprintf(_stdout,"\n");
  fprintf(_stdout,"  -ImgDir <directory>\n");
  fprintf(_stdout,"\tImage file Directory path \n");
  fprintf(_stdout,"  -i <compressed file>\n");
  fprintf(_stdout,"    REQUIRED only if an Input image directory not specified\n");
  fprintf(_stdout,"    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n");
  fprintf(_stdout,"    is identified based on its suffix.\n");
  fprintf(_stdout,"  -o <output file>\n");
  fprintf(_stdout,"    OPTIONAL\n");
  fprintf(_stdout,"    Output file where file info will be dump.\n");
  fprintf(_stdout,"    By default it will be in the stdout.\n");
  fprintf(_stdout,"  -v ");
  fprintf(_stdout,"    OPTIONAL\n");
  fprintf(_stdout,"    Enable informative messages\n");
  fprintf(_stdout,"    By default verbose mode is off.\n");
  fprintf(_stdout,"\n");
  return;
}

Assistant:

static void decode_help_display(void)
{
    fprintf(stdout, "\nThis is the opj_dump utility from the OpenJPEG project.\n"
            "It dumps JPEG 2000 codestream info to stdout or a given file.\n"
            "It has been compiled against openjp2 library v%s.\n\n", opj_version());

    fprintf(stdout, "Parameters:\n");
    fprintf(stdout, "-----------\n");
    fprintf(stdout, "\n");
    fprintf(stdout, "  -ImgDir <directory>\n");
    fprintf(stdout, "	Image file Directory path \n");
    fprintf(stdout, "  -i <compressed file>\n");
    fprintf(stdout,
            "    REQUIRED only if an Input image directory not specified\n");
    fprintf(stdout,
            "    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n");
    fprintf(stdout, "    is identified based on its suffix.\n");
    fprintf(stdout, "  -o <output file>\n");
    fprintf(stdout, "    OPTIONAL\n");
    fprintf(stdout, "    Output file where file info will be dump.\n");
    fprintf(stdout, "    By default it will be in the stdout.\n");
    fprintf(stdout, "  -v "); /* FIXME WIP_MSD */
    fprintf(stdout, "    OPTIONAL\n");
    fprintf(stdout, "    Enable informative messages\n");
    fprintf(stdout, "    By default verbose mode is off.\n");
    fprintf(stdout, "\n");
}